

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTUtilities.h
# Opt level: O1

void soul::ASTUtilities::findAllMainProcessors
               (ModuleBase *module,
               vector<soul::pool_ref<soul::AST::ProcessorBase>,_std::allocator<soul::pool_ref<soul::AST::ProcessorBase>_>_>
               *found)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Type *pTVar4;
  Property *pPVar5;
  long *extraout_RDX;
  pool_ref<soul::AST::ModuleBase> *m;
  pool_ptr<soul::AST::Constant> c;
  long local_50;
  PackedData local_48;
  long *plVar3;
  
  iVar2 = (*(module->super_Scope)._vptr_Scope[0x11])(&module->super_Scope);
  for (plVar3 = (long *)CONCAT44(extraout_var,iVar2); plVar3 != extraout_RDX; plVar3 = plVar3 + 1) {
    if (*plVar3 == 0) {
      pTVar4 = (Type *)0x0;
    }
    else {
      pTVar4 = (Type *)__dynamic_cast(*plVar3,&AST::ModuleBase::typeinfo,
                                      &AST::ProcessorBase::typeinfo,0);
    }
    if (((pTVar4 != (Type *)0x0) &&
        (pPVar5 = AST::Annotation::findProperty<char[5]>
                            ((Annotation *)(pTVar4 + 0xb),(char (*) [5])"main"),
        pPVar5 != (Property *)0x0)) &&
       ((*(((pPVar5->value).object)->super_Statement).super_ASTObject._vptr_ASTObject[0xd])
                  (&local_50), local_50 != 0)) {
      soul::Value::getData(&local_48,(Value *)(local_50 + 0x30));
      bVar1 = soul::Value::PackedData::getAsBool(&local_48);
      if (bVar1) {
        local_48.type = pTVar4;
        std::
        vector<soul::pool_ref<soul::AST::ProcessorBase>,std::allocator<soul::pool_ref<soul::AST::ProcessorBase>>>
        ::emplace_back<soul::pool_ref<soul::AST::ProcessorBase>>
                  ((vector<soul::pool_ref<soul::AST::ProcessorBase>,std::allocator<soul::pool_ref<soul::AST::ProcessorBase>>>
                    *)found,(pool_ref<soul::AST::ProcessorBase> *)&local_48);
      }
    }
    findAllMainProcessors((ModuleBase *)*plVar3,found);
  }
  return;
}

Assistant:

static void findAllMainProcessors (AST::ModuleBase& module, std::vector<pool_ref<AST::ProcessorBase>>& found)
    {
        for (auto& m : module.getSubModules())
        {
            if (auto pb = cast<AST::ProcessorBase> (m))
                if (auto main = pb->annotation.findProperty ("main"))
                    if (auto c = main->value->getAsConstant())
                        if (c->value.getAsBool())
                            found.push_back (*pb);

            findAllMainProcessors (m, found);
        }
    }